

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inspect_chunk(LodePNGState *state,size_t pos,uchar *in,size_t insize)

{
  byte *data;
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  byte *chunk;
  uint uVar4;
  ulong chunkLength;
  
  if (insize < pos + 4) {
    return 0x1e;
  }
  chunk = in + pos;
  if ((int)((uint)*chunk << 0x18) < 0) {
    return 0x3f;
  }
  uVar4 = (uint)chunk[3] | (uint)chunk[1] << 0x10 | (uint)chunk[2] << 8 | (uint)*chunk << 0x18;
  chunkLength = (ulong)uVar4;
  if (in + insize < chunk + chunkLength + 0xc) {
    return 0x1e;
  }
  data = chunk + 8;
  uVar2 = lodepng_chunk_type_equals(chunk,"PLTE");
  if (uVar2 == '\0') {
    uVar2 = lodepng_chunk_type_equals(chunk,"tRNS");
    if (uVar2 == '\0') {
      uVar2 = lodepng_chunk_type_equals(chunk,"bKGD");
      if (uVar2 == '\0') {
        uVar2 = lodepng_chunk_type_equals(chunk,"tEXt");
        if (uVar2 == '\0') {
          uVar2 = lodepng_chunk_type_equals(chunk,"zTXt");
          if (uVar2 == '\0') {
            uVar2 = lodepng_chunk_type_equals(chunk,"iTXt");
            if (uVar2 == '\0') {
              uVar2 = lodepng_chunk_type_equals(chunk,"tIME");
              if (uVar2 == '\0') {
                uVar2 = lodepng_chunk_type_equals(chunk,"pHYs");
                if (uVar2 == '\0') {
                  uVar2 = lodepng_chunk_type_equals(chunk,"gAMA");
                  if (uVar2 == '\0') {
                    uVar2 = lodepng_chunk_type_equals(chunk,"cHRM");
                    if (uVar2 == '\0') {
                      uVar2 = lodepng_chunk_type_equals(chunk,"sRGB");
                      if (uVar2 == '\0') {
                        uVar2 = lodepng_chunk_type_equals(chunk,"iCCP");
                        if (uVar2 == '\0') {
                          uVar3 = 0;
                          bVar1 = true;
                          goto LAB_0011fd81;
                        }
                        uVar3 = readChunk_iCCP(&state->info_png,(LodePNGDecompressSettings *)state,
                                               data,chunkLength);
                      }
                      else {
                        uVar3 = 0;
                        if (uVar4 == 1) {
                          (state->info_png).srgb_defined = 1;
                          (state->info_png).srgb_intent = (uint)*data;
                        }
                        else {
                          uVar3 = 0x62;
                        }
                      }
                    }
                    else {
                      uVar3 = readChunk_cHRM(&state->info_png,data,chunkLength);
                    }
                  }
                  else {
                    uVar3 = 0;
                    if (uVar4 == 4) {
                      (state->info_png).gama_defined = 1;
                      uVar4 = *(uint *)(chunk + 8);
                      (state->info_png).gama_gamma =
                           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18;
                    }
                    else {
                      uVar3 = 0x60;
                    }
                  }
                }
                else {
                  uVar3 = readChunk_pHYs(&state->info_png,data,chunkLength);
                }
              }
              else {
                uVar3 = readChunk_tIME(&state->info_png,data,chunkLength);
              }
            }
            else {
              uVar3 = readChunk_iTXt(&state->info_png,(LodePNGDecompressSettings *)state,data,
                                     chunkLength);
            }
          }
          else {
            uVar3 = readChunk_zTXt(&state->info_png,(LodePNGDecompressSettings *)state,data,
                                   chunkLength);
          }
        }
        else {
          uVar3 = readChunk_tEXt(&state->info_png,data,chunkLength);
        }
      }
      else {
        uVar3 = readChunk_bKGD(&state->info_png,data,chunkLength);
      }
    }
    else {
      uVar3 = readChunk_tRNS(&(state->info_png).color,data,chunkLength);
    }
  }
  else {
    uVar3 = readChunk_PLTE(&(state->info_png).color,data,chunkLength);
  }
  bVar1 = false;
LAB_0011fd81:
  if ((((!bVar1) && (uVar3 == 0)) && ((state->decoder).ignore_crc == 0)) &&
     (uVar4 = lodepng_chunk_check_crc(chunk), uVar4 != 0)) {
    return 0x39;
  }
  return uVar3;
}

Assistant:

unsigned lodepng_inspect_chunk(LodePNGState* state, size_t pos,
                               const unsigned char* in, size_t insize) {
  const unsigned char* chunk = in + pos;
  unsigned chunkLength;
  const unsigned char* data;
  unsigned unhandled = 0;
  unsigned error = 0;

  if(pos + 4 > insize) return 30;
  chunkLength = lodepng_chunk_length(chunk);
  if(chunkLength > 2147483647) return 63;
  data = lodepng_chunk_data_const(chunk);
  if(data + chunkLength + 4 > in + insize) return 30;

  if(lodepng_chunk_type_equals(chunk, "PLTE")) {
    error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
    error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
    error = readChunk_bKGD(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
    error = readChunk_tEXt(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
    error = readChunk_zTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
    error = readChunk_iTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
    error = readChunk_tIME(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
    error = readChunk_pHYs(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
    error = readChunk_gAMA(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
    error = readChunk_cHRM(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
    error = readChunk_sRGB(&state->info_png, data, chunkLength);
  } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
    error = readChunk_iCCP(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
  } else {
    /* unhandled chunk is ok (is not an error) */
    unhandled = 1;
  }

  if(!error && !unhandled && !state->decoder.ignore_crc) {
    if(lodepng_chunk_check_crc(chunk)) return 57; /*invalid CRC*/
  }

  return error;
}